

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_parse_schema_hash
                 (lyd_lyb_ctx *lybctx,lysc_node *sparent,lys_module *mod,lysc_node **snode)

{
  lylyb_ctx *lybctx_00;
  bool bVar1;
  lys_module *plVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  lysc_node *last;
  uint uVar5;
  char *format;
  lysc_module *module;
  ly_ctx *ctx;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  uint32_t options;
  byte bVar9;
  lyd_ctx *plVar10;
  ulong uVar11;
  uint8_t hash [7];
  byte local_57 [7];
  lyd_ctx *local_50;
  lysc_node *local_48;
  lysc_node **local_40;
  lys_module *local_38;
  
  *snode = (lysc_node *)0x0;
  lybctx_00 = lybctx->lybctx;
  local_50 = (lyd_ctx *)lybctx;
  local_48 = sparent;
  local_38 = mod;
  lyb_read(local_57,1,lybctx_00);
  bVar1 = true;
  local_40 = snode;
  if (local_57[0] == 0) {
    LVar4 = LY_SUCCESS;
    uVar8 = 1;
  }
  else {
    uVar8 = 0;
    if (-1 < (char)local_57[0]) {
      do {
        if ((int)uVar8 == 9) {
          bVar1 = false;
          LVar4 = LY_EINT;
          ly_log(lybctx_00->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                 ,0x2df);
          goto LAB_0013a688;
        }
        bVar9 = (byte)uVar8;
        uVar5 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar5;
      } while (((uint)local_57[0] << (bVar9 & 0x1f) & 0x40) == 0);
      uVar8 = (ulong)uVar5;
    }
    bVar7 = (byte)uVar8;
    local_57[uVar8 & 0xff] = local_57[0];
    bVar9 = bVar7;
    while (bVar9 != 0) {
      uVar5 = ((uint)uVar8 & 0xff) - 1;
      lyb_read(local_57 + uVar5,1,lybctx_00);
      bVar9 = local_57[uVar5];
      if (-1 < (char)(bVar9 << ((byte)uVar5 & 0x1f))) {
        __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      ,0x2eb,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
      }
      if ((bVar9 >> (9U - (char)uVar8 & 0x1f) & 0x7f) != 0) {
        __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      ,0x2ed,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
      }
      bVar9 = (char)uVar8 - 1;
      uVar8 = (ulong)bVar9;
    }
    uVar8 = (ulong)(byte)(bVar7 + 1);
    LVar4 = LY_SUCCESS;
  }
LAB_0013a688:
  plVar2 = local_38;
  if (bVar1) {
    if (local_57[0] != 0) {
      options = (local_50->int_opts & 4) << 2;
      last = (lysc_node *)0x0;
      plVar10 = local_50;
      while( true ) {
        do {
          if ((local_48 == (lysc_node *)0x0) && (plVar10->ext != (lysc_ext_instance *)0x0)) {
            last = lys_getnext_ext(last,(lysc_node *)0x0,plVar10->ext,options);
          }
          else {
            if (plVar2 == (lys_module *)0x0) {
              module = (lysc_module *)0x0;
            }
            else {
              module = plVar2->compiled;
            }
            last = lys_getnext(last,local_48,module,options);
          }
          if (last == (lysc_node *)0x0) {
            if (((ulong)*(anon_union_8_2_ef77c6a4_for_lyd_lyb_ctx_1 *)&plVar10->parse_opts & 0x20000
                ) != 0) {
              if (plVar10->ext == (lysc_ext_instance *)0x0) {
                ctx = ((lylyb_ctx *)plVar10->data_ctx)->ctx;
                if (plVar2 == (lys_module *)0x0) {
                  pcVar6 = local_48->name;
                  format = "Failed to find matching hash for a child node of \"%s\".";
                }
                else {
                  pcVar6 = plVar2->name;
                  format = "Failed to find matching hash for a top-level node from \"%s\".";
                }
              }
              else {
                ctx = ((lylyb_ctx *)plVar10->data_ctx)->ctx;
                pcVar6 = plVar10->ext->def->name;
                format = 
                "Failed to find matching hash for a node from \"%s\" extension instance node.";
              }
              ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,format,pcVar6);
              return LY_EVALID;
            }
            goto LAB_0013a76f;
          }
        } while ((last->module->ctx == ((lylyb_ctx *)plVar10->data_ctx)->ctx) &&
                (lVar3 = lyb_has_schema_model(last,((lylyb_ctx *)plVar10->data_ctx)->models),
                lVar3 == '\0'));
        if ((char)uVar8 == '\0') break;
        uVar11 = 0;
        while (bVar9 = lyb_get_hash(last,(uint8_t)uVar11), plVar10 = local_50,
              bVar9 == local_57[uVar11]) {
          uVar11 = uVar11 + 1;
          if ((uVar8 & 0xff) == uVar11) goto LAB_0013a75b;
        }
      }
LAB_0013a75b:
      LVar4 = lyd_parser_check_schema(local_50,last);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
LAB_0013a76f:
      *local_40 = last;
    }
    LVar4 = LY_SUCCESS;
  }
  return LVar4;
}

Assistant:

static LY_ERR
lyb_parse_schema_hash(struct lyd_lyb_ctx *lybctx, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_node **snode)
{
    LY_ERR ret;
    const struct lysc_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];
    uint32_t getnext_opts;
    uint8_t hash_count;

    *snode = NULL;

    ret = lyb_read_hashes(lybctx->lybctx, hash, &hash_count);
    LY_CHECK_RET(ret);

    if (!hash[0]) {
        /* opaque node */
        return LY_SUCCESS;
    }

    getnext_opts = lybctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    /* find our node with matching hashes */
    sibling = NULL;
    while (1) {
        if (!sparent && lybctx->ext) {
            sibling = lys_getnext_ext(sibling, sparent, lybctx->ext, getnext_opts);
        } else {
            sibling = lys_getnext(sibling, sparent, mod ? mod->compiled : NULL, getnext_opts);
        }
        if (!sibling) {
            break;
        }
        /* skip schema nodes from models not present during printing */
        if (((sibling->module->ctx != lybctx->lybctx->ctx) || lyb_has_schema_model(sibling, lybctx->lybctx->models)) &&
                lyb_is_schema_hash_match((struct lysc_node *)sibling, hash, hash_count)) {
            /* match found */
            break;
        }
    }

    if (!sibling && (lybctx->parse_opts & LYD_PARSE_STRICT)) {
        if (lybctx->ext) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a node from \"%s\" extension instance node.",
                    lybctx->ext->def->name);
        } else if (mod) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a top-level node"
                    " from \"%s\".", mod->name);
        } else {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a child node"
                    " of \"%s\".", sparent->name);
        }
        return LY_EVALID;
    } else if (sibling && (ret = lyd_parser_check_schema((struct lyd_ctx *)lybctx, sibling))) {
        return ret;
    }

    *snode = sibling;
    return LY_SUCCESS;
}